

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Date *d)

{
  ostream *poVar1;
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_14,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,d->y);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_13,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,d->m);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_12,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,d->d);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Date& d)
{
	return os << '(' << d.year()
		<< ',' << d.month()
		<< ',' << d.day() << ')';
}